

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Part.cpp
# Opt level: O3

bool __thiscall MT32Emu::Part::abortFirstPoly(Part *this,PolyState polyState)

{
  byte bVar1;
  byte bVar2;
  PolyState PVar3;
  Poly *this_00;
  undefined8 in_RCX;
  
  bVar2 = (byte)in_RCX;
  this_00 = (this->activePolys).firstPoly;
  do {
    if (this_00 == (Poly *)0x0) {
      bVar1 = 0;
LAB_00181f25:
      return (bool)(bVar1 & bVar2);
    }
    PVar3 = Poly::getState(this_00);
    if (PVar3 == polyState) {
      bVar2 = Poly::startAbort(this_00);
      bVar1 = 1;
      goto LAB_00181f25;
    }
    this_00 = Poly::getNext(this_00);
    bVar2 = (byte)in_RCX;
  } while( true );
}

Assistant:

Poly *PolyList::getFirst() const {
	return firstPoly;
}